

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  byte bVar1;
  short sVar2;
  SrcList *pSVar3;
  WhereLoop *pWVar4;
  Index *pIVar5;
  Table *pTVar6;
  Vdbe *p;
  int addr;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  char zBuf [100];
  StrAccum local_d8;
  Parse *local_b8;
  Vdbe *local_b0;
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = pWInfo->pTabList;
  bVar1 = pLevel->iFrom;
  local_d8.db = pParse->db;
  local_b0 = pParse->pVdbe;
  local_d8.zText = local_a8;
  local_d8.nAlloc = 100;
  local_d8.mxAlloc = 1000000000;
  local_d8.nChar = 0;
  local_d8.accError = '\0';
  local_d8.printfFlags = '\x01';
  local_b8 = pParse;
  sqlite3_str_appendf(&local_d8,"BLOOM FILTER ON %S (",pSVar3->a + bVar1);
  pWVar4 = pLevel->pWLoop;
  if ((pWVar4->wsFlags & 0x100) == 0) {
    uVar9 = (ulong)pWVar4->nSkip;
    if (pWVar4->nSkip < (pWVar4->u).btree.nEq) {
      do {
        pIVar5 = (pWVar4->u).btree.pIndex;
        sVar2 = pIVar5->aiColumn[uVar9];
        pcVar8 = "<expr>";
        if (sVar2 != -2) {
          if (sVar2 == -1) {
            pcVar8 = "rowid";
          }
          else {
            pcVar8 = pIVar5->pTable->aCol[sVar2].zCnName;
          }
        }
        if (pWVar4->nSkip < uVar9) {
          if (local_d8.nChar + 5 < local_d8.nAlloc) {
            builtin_strncpy(local_d8.zText + local_d8.nChar," AND ",5);
            local_d8.nChar = local_d8.nChar + 5;
          }
          else {
            enlargeAndAppend(&local_d8," AND ",5);
          }
        }
        sqlite3_str_appendf(&local_d8,"%s=?",pcVar8);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (pWVar4->u).btree.nEq);
    }
  }
  else {
    pTVar6 = pSVar3->a[bVar1].pTab;
    lVar7 = (long)pTVar6->iPKey;
    if (lVar7 < 0) {
      sqlite3_str_appendf(&local_d8,"rowid=?");
    }
    else {
      sqlite3_str_appendf(&local_d8,"%s=?",pTVar6->aCol[lVar7].zCnName);
    }
  }
  if (local_d8.nChar + 1 < local_d8.nAlloc) {
    local_d8.zText[local_d8.nChar] = ')';
    local_d8.nChar = local_d8.nChar + 1;
  }
  else {
    enlargeAndAppend(&local_d8,")",1);
  }
  pcVar8 = sqlite3StrAccumFinish(&local_d8);
  p = local_b0;
  addr = sqlite3VdbeAddOp3(local_b0,0xb9,local_b0->nOp,local_b8->addrExplain,0);
  sqlite3VdbeChangeP4(p,addr,pcVar8,-6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}